

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

TValue * newkey(lua_State *L,Table *t,TValue *key)

{
  int iVar1;
  global_State *pgVar2;
  Value VVar3;
  undefined8 uVar4;
  bool bVar5;
  Node *pNVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  Node *pNVar10;
  Node *pNVar11;
  uint uVar12;
  uint uVar13;
  Node *pNVar14;
  uint nasize;
  long lVar15;
  int iVar16;
  int ause;
  int iVar17;
  int iVar18;
  long lVar19;
  int *piVar20;
  int iVar21;
  Node *pNVar22;
  int nums [31];
  int local_b8 [34];
  
  pNVar10 = mainposition(t,key);
  if ((pNVar10 == &dummynode_) || ((pNVar10->i_val).tt != 0)) {
    pNVar11 = t->node;
    pNVar14 = t->lastfree;
    do {
      pNVar22 = pNVar14 + -1;
      t->lastfree = pNVar22;
      if (pNVar14 <= pNVar11) {
        pNVar22 = (Node *)0x0;
        break;
      }
      pNVar6 = pNVar14 + -1;
      pNVar14 = pNVar22;
    } while ((pNVar6->i_key).nk.tt != 0);
    if (pNVar22 == (Node *)0x0) {
      local_b8[0x1c] = 0;
      local_b8[0x1d] = 0;
      local_b8[0x1e] = 0;
      local_b8[0x18] = 0;
      local_b8[0x19] = 0;
      local_b8[0x1a] = 0;
      local_b8[0x1b] = 0;
      local_b8[0x14] = 0;
      local_b8[0x15] = 0;
      local_b8[0x16] = 0;
      local_b8[0x17] = 0;
      local_b8[0x10] = 0;
      local_b8[0x11] = 0;
      local_b8[0x12] = 0;
      local_b8[0x13] = 0;
      local_b8[0xc] = 0;
      local_b8[0xd] = 0;
      local_b8[0xe] = 0;
      local_b8[0xf] = 0;
      local_b8[8] = 0;
      local_b8[9] = 0;
      local_b8[10] = 0;
      local_b8[0xb] = 0;
      local_b8[4] = 0;
      local_b8[5] = 0;
      local_b8[6] = 0;
      local_b8[7] = 0;
      local_b8[0] = 0;
      local_b8[1] = 0;
      local_b8[2] = 0;
      local_b8[3] = 0;
      iVar21 = t->sizearray;
      lVar15 = 0;
      iVar18 = 1;
      iVar17 = 0;
      iVar16 = 1;
      do {
        iVar8 = iVar16;
        if ((iVar21 < iVar16) && (iVar8 = iVar21, iVar21 < iVar18)) {
          bVar5 = false;
        }
        else {
          iVar9 = 0;
          if (iVar18 <= iVar8) {
            lVar19 = (long)iVar18 + -1;
            piVar20 = &t->array[(long)iVar18 + -1].tt;
            iVar9 = 0;
            do {
              iVar9 = (iVar9 + 1) - (uint)(*piVar20 == 0);
              lVar19 = lVar19 + 1;
              piVar20 = piVar20 + 4;
            } while (lVar19 < iVar8);
            iVar18 = iVar8 + 1;
          }
          local_b8[lVar15] = local_b8[lVar15] + iVar9;
          iVar17 = iVar17 + iVar9;
          bVar5 = true;
        }
        if (!bVar5) break;
        lVar15 = lVar15 + 1;
        iVar16 = iVar16 * 2;
      } while (lVar15 != 0x1f);
      iVar21 = 0;
      iVar18 = 0;
      iVar16 = 0;
      if (t->lsizenode < 0x20) {
        lVar15 = (0x100000000 << (t->lsizenode & 0x3f)) >> 0x20;
        piVar20 = &pNVar11[lVar15 + -1].i_val.tt;
        iVar16 = 0;
        iVar18 = 0;
        do {
          if (*piVar20 != 0) {
            iVar8 = countint((TValue *)(piVar20 + 2),local_b8);
            iVar18 = iVar18 + iVar8;
            iVar16 = iVar16 + 1;
          }
          lVar15 = lVar15 + -1;
          piVar20 = piVar20 + -10;
        } while (lVar15 != 0);
      }
      piVar20 = local_b8;
      iVar8 = countint(key,piVar20);
      nasize = 0;
      iVar9 = iVar8 + iVar18 + iVar17;
      if (iVar9 != 0 && SCARRY4(iVar8,iVar18 + iVar17) == iVar9 < 0) {
        uVar13 = 0;
        nasize = 0;
        iVar21 = 0;
        iVar18 = 0;
        uVar12 = 1;
        do {
          iVar1 = *piVar20;
          iVar8 = iVar1 + iVar18;
          if (0 < iVar1) {
            iVar18 = iVar8;
          }
          if (0 < iVar1 && (int)uVar13 < iVar8) {
            nasize = uVar12;
            iVar21 = iVar8;
          }
          if (iVar18 == iVar9) break;
          uVar13 = uVar12 & 0x7fffffff;
          piVar20 = piVar20 + 1;
          uVar12 = uVar12 * 2;
        } while ((int)uVar13 < iVar9);
      }
      resize(L,t,nasize,((iVar17 + iVar16) - iVar21) + 1);
      pNVar11 = (Node *)luaH_set(L,t,key);
    }
    else {
      pNVar11 = mainposition(t,&(pNVar10->i_key).tvk);
      if (pNVar11 == pNVar10) {
        pNVar11 = (pNVar10->i_key).nk.next;
        (pNVar22->i_key).nk.next = pNVar11;
        (pNVar10->i_key).nk.next = pNVar22;
        pNVar10 = pNVar22;
      }
      else {
        do {
          pNVar14 = pNVar11;
          pNVar11 = (pNVar14->i_key).nk.next;
        } while (pNVar11 != pNVar10);
        (pNVar14->i_key).nk.next = pNVar22;
        pNVar11 = (pNVar10->i_key).nk.next;
        (pNVar22->i_key).nk.next = pNVar11;
        VVar3 = (pNVar10->i_val).value;
        iVar21 = (pNVar10->i_val).tt;
        uVar7 = *(undefined4 *)&(pNVar10->i_val).field_0xc;
        uVar4 = *(undefined8 *)((long)&pNVar10->i_key + 8);
        (pNVar22->i_key).nk.value = (pNVar10->i_key).nk.value;
        *(undefined8 *)((long)&pNVar22->i_key + 8) = uVar4;
        (pNVar22->i_val).value = VVar3;
        (pNVar22->i_val).tt = iVar21;
        *(undefined4 *)&(pNVar22->i_val).field_0xc = uVar7;
        (pNVar10->i_key).nk.next = (Node *)0x0;
        (pNVar10->i_val).tt = 0;
      }
    }
    if (pNVar22 == (Node *)0x0) {
      return &pNVar11->i_val;
    }
  }
  (pNVar10->i_key).nk.value = key->value;
  (pNVar10->i_key).nk.tt = key->tt;
  if (((3 < key->tt) && (((((key->value).gc)->gch).marked & 3) != 0)) && ((t->marked & 4) != 0)) {
    pgVar2 = L->l_G;
    t->marked = t->marked & 0xfb;
    t->gclist = pgVar2->grayagain;
    pgVar2->grayagain = (GCObject *)t;
  }
  return &pNVar10->i_val;
}

Assistant:

static TValue*newkey(lua_State*L,Table*t,const TValue*key){
Node*mp=mainposition(t,key);
if(!ttisnil(gval(mp))||mp==(&dummynode_)){
Node*othern;
Node*n=getfreepos(t);
if(n==NULL){
rehash(L,t,key);
return luaH_set(L,t,key);
}
othern=mainposition(t,key2tval(mp));
if(othern!=mp){
while(gnext(othern)!=mp)othern=gnext(othern);
gnext(othern)=n;
*n=*mp;
gnext(mp)=NULL;
setnilvalue(gval(mp));
}
else{
gnext(n)=gnext(mp);
gnext(mp)=n;
mp=n;
}
}
gkey(mp)->value=key->value;gkey(mp)->tt=key->tt;
luaC_barriert(L,t,key);
return gval(mp);
}